

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O3

bool __thiscall
Minisat::OnlineProofChecker::removeClause<Minisat::Clause>(OnlineProofChecker *this,Clause *cls)

{
  int *piVar1;
  ulong *puVar2;
  int iVar3;
  Lit *pLVar4;
  pointer puVar5;
  pointer pvVar6;
  vec<Minisat::Watcher> *pvVar7;
  Watcher *pWVar8;
  bool bVar9;
  uint *puVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  anon_struct_8_10_eb538618_for_header aVar18;
  long lVar19;
  long lVar20;
  pointer puVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  
  if (3 < this->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] remove clause ",0x1c);
    if (0x3ffffffff < (ulong)cls->header) {
      uVar13 = 0;
      do {
        uVar12 = *(uint *)(&cls[1].header.field_0x0 + uVar13 * 4);
        uVar14 = (int)uVar12 >> 1;
        uVar17 = ~uVar14;
        if ((uVar12 & 1) == 0) {
          uVar17 = uVar14 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar17);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)cls->header >> 0x22);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    printState(this);
  }
  bVar9 = true;
  if ((0x3ffffffff < (ulong)cls->header) && (this->ok == true)) {
    if (((ulong)cls->header & 0xfffffffc00000000) == 0x400000000) {
      lVar20 = (long)(this->unitClauses).sz;
      if (0 < lVar20) {
        pLVar4 = (this->unitClauses).data;
        lVar11 = 0;
        do {
          if (pLVar4[lVar11].x == *(int *)&cls[1].header) {
            pLVar4[lVar11].x = pLVar4[lVar20 + -1].x;
            piVar1 = &(this->unitClauses).sz;
            *piVar1 = *piVar1 + -1;
            if (this->verbose < 2) {
              return true;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ",0x1d);
            if (0x3ffffffff < (ulong)cls->header) {
              uVar13 = 0;
              do {
                uVar12 = *(uint *)(&cls[1].header.field_0x0 + uVar13 * 4);
                uVar14 = (int)uVar12 >> 1;
                uVar17 = ~uVar14;
                if ((uVar12 & 1) == 0) {
                  uVar17 = uVar14 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                uVar13 = uVar13 + 1;
              } while (uVar13 < (ulong)cls->header >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
LAB_001250dd:
            std::ostream::put('X');
            std::ostream::flush();
            return true;
          }
          lVar11 = lVar11 + 1;
        } while (lVar20 != lVar11);
      }
    }
    else {
      uVar12 = (this->ma).step;
      if (0x3fffffff < uVar12) {
        puVar5 = (this->ma).array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar12 = 0;
        memset(puVar5,0,(long)(this->ma).array.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar5);
      }
      (this->ma).step = uVar12 + 1;
      puVar5 = (this->ma).array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar5[*(uint *)&cls[1].header] = uVar12 + 1;
      aVar18 = cls->header;
      uVar12 = 0;
      pvVar6 = (this->occ).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)aVar18 >> 0x23 != 0) {
        uVar17 = (this->ma).step;
        uVar12 = 0;
        uVar13 = 1;
        do {
          puVar5[*(uint *)(&cls[1].header.field_0x0 + uVar13 * 4)] = uVar17;
          iVar3 = *(int *)(&cls[1].header.field_0x0 + uVar13 * 4);
          uVar14 = (uint)uVar13;
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar6[(int)uVar12].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar6[(int)uVar12].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data) <=
              (ulong)((long)*(pointer *)
                             ((long)&pvVar6[iVar3].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar6[iVar3].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data)) {
            uVar14 = uVar12;
          }
          uVar12 = uVar14;
          uVar13 = uVar13 + 1;
          aVar18 = cls->header;
        } while (uVar13 < (ulong)aVar18 >> 0x22);
      }
      iVar3 = *(int *)(&cls[1].header.field_0x0 + (long)(int)uVar12 * 4);
      uVar13 = (ulong)iVar3;
      lVar20 = *(long *)&pvVar6[uVar13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data;
      puVar21 = *(pointer *)
                 ((long)&pvVar6[uVar13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8);
      lVar11 = (long)puVar21 - lVar20;
      if (lVar11 != 0) {
        puVar10 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        lVar19 = 0;
LAB_001249d7:
        uVar17 = *(uint *)(lVar20 + lVar19 * 4);
        uVar24 = *(ulong *)(puVar10 + uVar17) >> 0x22;
        if (uVar24 == (ulong)aVar18 >> 0x22) {
          if (*(ulong *)(puVar10 + uVar17) < 0x400000000) {
LAB_00124a2c:
            *(undefined4 *)(lVar20 + lVar19 * 4) = *(undefined4 *)(lVar20 + -4 + lVar11);
            puVar21 = puVar21 + -1;
            *(pointer *)
             ((long)&pvVar6[uVar13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data + 8) = puVar21;
            if (((long)puVar21 - lVar20 == -4) || (uVar17 == 0xffffffff)) goto LAB_00124f36;
            if (0x3ffffffff < (ulong)cls->header) {
              uVar13 = 0;
              do {
                if (uVar13 != uVar12) {
                  pvVar6 = (this->occ).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           *(int *)(&cls[1].header.field_0x0 + uVar13 * 4);
                  lVar20 = *(long *)&(pvVar6->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data;
                  puVar5 = *(pointer *)
                            ((long)&(pvVar6->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data + 8);
                  lVar11 = (long)puVar5 - lVar20 >> 2;
                  if ((long)puVar5 - lVar20 == 0) {
                    lVar19 = 0;
                  }
                  else {
                    lVar19 = lVar11 + (ulong)(lVar11 == 0);
                    lVar22 = 0;
                    do {
                      if (*(uint *)(lVar20 + lVar22 * 4) == uVar17) {
                        *(undefined4 *)(lVar20 + lVar22 * 4) =
                             *(undefined4 *)(lVar20 + -4 + ((long)puVar5 - lVar20));
                        *(pointer *)
                         ((long)&(pvVar6->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + 8) = puVar5 + -1;
                        lVar11 = (long)(puVar5 + -1) - lVar20 >> 2;
                        lVar19 = -1;
                        break;
                      }
                      lVar22 = lVar22 + 1;
                    } while (lVar19 != lVar22);
                  }
                  if (lVar19 == lVar11) {
                    if (1 < this->verbose) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"c could not remove clause ",0x1a);
                      if (0x3ffffffff < (ulong)cls->header) {
                        uVar24 = 0;
                        do {
                          uVar14 = *(uint *)(&cls[1].header.field_0x0 + uVar24 * 4);
                          uVar15 = (int)uVar14 >> 1;
                          uVar16 = ~uVar15;
                          if ((uVar14 & 1) == 0) {
                            uVar16 = uVar15 + 1;
                          }
                          std::ostream::operator<<((ostream *)&std::cerr,uVar16);
                          std::ostream::flush();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr," ",1);
                          uVar24 = uVar24 + 1;
                        } while (uVar24 < (ulong)cls->header >> 0x22);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr," from list of literal ",0x16);
                      uVar14 = *(uint *)(&cls[1].header.field_0x0 + uVar13 * 4);
                      uVar15 = (int)uVar14 >> 1;
                      uVar16 = ~uVar15;
                      if ((uVar14 & 1) == 0) {
                        uVar16 = uVar15 + 1;
                      }
                      std::ostream::operator<<((ostream *)&std::cerr,uVar16);
                      std::ostream::flush();
                      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                      std::ostream::put('X');
                      std::ostream::flush();
                    }
                    printState(this);
                    if (2 < this->verbose) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"c list for ",0xb);
                      uVar14 = *(uint *)(&cls[1].header.field_0x0 + uVar13 * 4);
                      uVar15 = (int)uVar14 >> 1;
                      uVar16 = ~uVar15;
                      if ((uVar14 & 1) == 0) {
                        uVar16 = uVar15 + 1;
                      }
                      std::ostream::operator<<((ostream *)&std::cerr,uVar16);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr," : ",3);
                      if (*(pointer *)
                           ((long)&(pvVar6->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data + 8) !=
                          (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start) {
                        uVar24 = 0;
                        do {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"c ",2);
                          uVar14 = *(uint *)(*(long *)&(pvVar6->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data + uVar24 * 4);
                          puVar10 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                          if (0x3ffffffff < *(ulong *)(puVar10 + uVar14)) {
                            puVar2 = (ulong *)(puVar10 + uVar14);
                            uVar23 = 0;
                            do {
                              uVar14 = *(uint *)((long)puVar2 + uVar23 * 4 + 8);
                              uVar15 = (int)uVar14 >> 1;
                              uVar16 = ~uVar15;
                              if ((uVar14 & 1) == 0) {
                                uVar16 = uVar15 + 1;
                              }
                              std::ostream::operator<<((ostream *)&std::cerr,uVar16);
                              std::ostream::flush();
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr," ",1);
                              uVar23 = uVar23 + 1;
                            } while (uVar23 < *puVar2 >> 0x22);
                          }
                          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                          std::ostream::put('X');
                          std::ostream::flush();
                          uVar24 = uVar24 + 1;
                        } while (uVar24 < (ulong)((long)*(pointer *)
                                                         ((long)&(pvVar6->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                                  *(long *)&(pvVar6->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data >> 2));
                      }
                    }
                  }
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < (ulong)cls->header >> 0x22);
              puVar10 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            }
            uVar13 = (long)(int)puVar10[(ulong)uVar17 + 2] ^ 1;
            pvVar7 = (this->watches).occs.data;
            lVar11 = (long)pvVar7[uVar13].sz;
            pWVar8 = pvVar7[uVar13].data;
            lVar19 = 0;
            lVar20 = lVar19;
            if (0 < lVar11) {
              do {
                lVar20 = lVar19;
                if (pWVar8[lVar19].cref == uVar17) break;
                lVar19 = lVar19 + 1;
                lVar20 = lVar11;
              } while (lVar11 != lVar19);
            }
            pWVar8[lVar20] = pWVar8[lVar11 + -1];
            pvVar7[uVar13].sz = pvVar7[uVar13].sz + -1;
            uVar13 = (long)(int)puVar10[(ulong)uVar17 + 3] ^ 1;
            pvVar7 = (this->watches).occs.data;
            lVar11 = (long)pvVar7[uVar13].sz;
            pWVar8 = pvVar7[uVar13].data;
            lVar19 = 0;
            lVar20 = lVar19;
            if (0 < lVar11) {
              do {
                lVar20 = lVar19;
                if (pWVar8[lVar19].cref == uVar17) break;
                lVar19 = lVar19 + 1;
                lVar20 = lVar11;
              } while (lVar11 != lVar19);
            }
            pWVar8[lVar20] = pWVar8[lVar11 + -1];
            pvVar7[uVar13].sz = pvVar7[uVar13].sz + -1;
            puVar10 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            *(ulong *)(puVar10 + uVar17) = (*(ulong *)(puVar10 + uVar17) & 0xfffffffffffffffc) + 1;
            uVar13 = *(ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar17);
            uVar12 = 2;
            if ((uVar13 & 4) == 0) {
              uVar12 = (uint)(uVar13 >> 3) & 1;
            }
            (this->ca).super_RegionAllocator<unsigned_int>.wasted_ =
                 uVar12 + (uint)(uVar13 >> 0x22) +
                          (this->ca).super_RegionAllocator<unsigned_int>.wasted_ + 2;
            if (this->verbose < 2) {
              return true;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ",0x1d);
            if (0x3ffffffff < (ulong)cls->header) {
              uVar13 = 0;
              do {
                uVar12 = *(uint *)(&cls[1].header.field_0x0 + uVar13 * 4);
                uVar16 = (int)uVar12 >> 1;
                uVar14 = ~uVar16;
                if ((uVar12 & 1) == 0) {
                  uVar14 = uVar16 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar14);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                uVar13 = uVar13 + 1;
              } while (uVar13 < (ulong)cls->header >> 0x22);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," which is internally ",0x15);
            puVar10 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            if (0x3ffffffff < *(ulong *)(puVar10 + uVar17)) {
              puVar2 = (ulong *)(puVar10 + uVar17);
              uVar13 = 0;
              do {
                uVar12 = *(uint *)((long)puVar2 + uVar13 * 4 + 8);
                uVar14 = (int)uVar12 >> 1;
                uVar17 = ~uVar14;
                if ((uVar12 & 1) == 0) {
                  uVar17 = uVar14 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                uVar13 = uVar13 + 1;
              } while (uVar13 < *puVar2 >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
            goto LAB_001250dd;
          }
          uVar23 = 0;
          while (puVar5[puVar10[(ulong)uVar17 + uVar23 + 2]] == (this->ma).step) {
            uVar23 = uVar23 + 1;
            if (uVar24 == uVar23) goto LAB_00124a2c;
          }
        }
        lVar19 = lVar19 + 1;
        if (lVar19 == (lVar11 >> 2) + (ulong)(lVar11 >> 2 == 0)) goto LAB_00124f36;
        goto LAB_001249d7;
      }
LAB_00124f36:
      if (1 < this->verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] could not remove clause ",0x26);
        if (0x3ffffffff < (ulong)cls->header) {
          uVar24 = 0;
          do {
            uVar12 = *(uint *)(&cls[1].header.field_0x0 + uVar24 * 4);
            uVar14 = (int)uVar12 >> 1;
            uVar17 = ~uVar14;
            if ((uVar12 & 1) == 0) {
              uVar17 = uVar14 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar17);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            uVar24 = uVar24 + 1;
          } while (uVar24 < (ulong)cls->header >> 0x22);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," from list of literal ",0x16);
        uVar17 = iVar3 >> 1;
        uVar12 = ~uVar17;
        if ((uVar13 & 1) == 0) {
          uVar12 = uVar17 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar12);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
      printState(this);
    }
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

inline bool OnlineProofChecker::removeClause(const T &cls)
{
    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] remove clause " << cls << std::endl;
        printState();
    }

    if (cls.size() == 0 || !ok) {
        return true;
    } // do not handle empty clauses here!
    if (cls.size() == 1) {
        const Lit l = cls[0];
        int i = 0;
        bool found = false;
        for (; i < unitClauses.size(); ++i) {
            if (unitClauses[i] == l) {
                unitClauses[i] = unitClauses[unitClauses.size() - 1];
                unitClauses.pop();
                found = true;
                break; // remove only once!
            }
        }
        if (!found) {
            assert(false && "the unit clause should be inside the vector of units");
            return false;
        }
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] removed clause " << cls << std::endl;
        }
        return true;
    }
    // find correct CRef ...
    ma.nextStep();
    int smallestIndex = 0;
    ma.setCurrentStep(toInt(cls[0]));
    for (int i = 1; i < cls.size(); ++i) {
        ma.setCurrentStep(toInt(cls[i]));
        if (occ[toInt(cls[i])].size() < occ[smallestIndex].size()) {
            smallestIndex = i;
        }
    }

    const Lit smallest = cls[smallestIndex];

    CRef ref = CRef_Undef;
    size_t i = 0;
    for (; i < occ[toInt(smallest)].size(); ++i) {
        const Clause &c = ca[occ[toInt(smallest)][i]];
        if (c.size() != cls.size()) {
            continue;
        } // do not check this clause!

        int hit = 0;
        for (; hit < c.size(); ++hit) {
            if (!ma.isCurrentStep(toInt(c[hit]))) {
                break;
            } // a literal is not in both clauses, not the correct clause
        }
        if (hit < c.size()) {
            continue;
        } // not the right clause -> check next!

        ref = occ[toInt(smallest)][i];
        // remove from this occ-list
        occ[toInt(smallest)][i] = occ[toInt(smallest)][occ[toInt(smallest)].size() - 1];
        occ[toInt(smallest)].pop_back();
        i = ~0; // set to indicate that we found the clause
        break;
    }
    if (i == occ[toInt(smallest)].size() || ref == CRef_Undef) {
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] could not remove clause " << cls << " from list of literal " << smallest << std::endl;
        }
        printState();
        assert(false && "clause should be in the data structures");
        return false;
    }

    // remove from the other occ-lists!
    for (int i = 0; i < cls.size(); ++i) {
        if (i == smallestIndex) {
            continue;
        }
        std::vector<CRef> &list = occ[toInt(cls[i])];
        size_t j = 0;
        for (; j < list.size(); ++j) {
            if (list[j] == ref) {
                list[j] = list[list.size() - 1];
                list.pop_back(); // remove the element
                j = -1;          // point somewhere invalid
                break;
            }
        }
        if (j == list.size()) {
            if (verbose > 1) {
                std::cerr << "c could not remove clause " << cls << " from list of literal " << cls[i] << std::endl;
            }
            printState();
            if (verbose > 2) {
                std::cerr << "c list for " << cls[i] << " : ";
                for (size_t k = 0; k < list.size(); ++k) {
                    std::cerr << "c " << ca[list[k]] << std::endl;
                }
            }
            assert(false && "should be able to remove the clause from all lists");
        }
    }

    // remove the clause from the two watched literal structures!
    detachClause(ref);

    // tell the garbage-collection-system that the clause can be removed
    ca[ref].mark(1);
    ca.free(ref);

    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] removed clause " << cls << " which is internally " << ca[ref] << std::endl;
    }
    // check garbage collection once in a while!
    // TODO
    return true;
}